

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

void save(LexState *ls,int c)

{
  Mbuffer *pMVar1;
  ulong osize;
  char *pcVar2;
  size_t sVar3;
  ulong uVar4;
  
  pMVar1 = ls->buff;
  sVar3 = pMVar1->n;
  osize = pMVar1->buffsize;
  uVar4 = sVar3 + 1;
  if (osize < uVar4) {
    if (0x7ffffffffffffffd < osize) {
      luaX_lexerror(ls,"lexical element too long",0);
    }
    pcVar2 = (char *)luaM_realloc_(ls->L,pMVar1->buffer,osize,osize * 2);
    pMVar1->buffer = pcVar2;
    pMVar1->buffsize = osize * 2;
    sVar3 = pMVar1->n;
    uVar4 = sVar3 + 1;
  }
  else {
    pcVar2 = pMVar1->buffer;
  }
  pMVar1->n = uVar4;
  pcVar2[sVar3] = (char)c;
  return;
}

Assistant:

static void save(LexState*ls,int c){
Mbuffer*b=ls->buff;
if(b->n+1>b->buffsize){
size_t newsize;
if(b->buffsize>=((size_t)(~(size_t)0)-2)/2)
luaX_lexerror(ls,"lexical element too long",0);
newsize=b->buffsize*2;
luaZ_resizebuffer(ls->L,b,newsize);
}
b->buffer[b->n++]=cast(char,c);
}